

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

t_scalar * scalar_new(_glist *owner,t_symbol *templatesym)

{
  int iVar1;
  undefined1 local_48 [8];
  t_gpointer gp;
  t_template *template;
  t_scalar *x;
  t_symbol *templatesym_local;
  _glist *owner_local;
  
  gpointer_init((t_gpointer *)local_48);
  gp.gp_stub = (t_gstub *)template_findbyname(templatesym);
  if ((t_template *)gp.gp_stub == (t_template *)0x0) {
    pd_error((void *)0x0,"scalar: couldn\'t find template %s",templatesym->s_name);
    owner_local = (_glist *)0x0;
  }
  else {
    iVar1 = template_cancreate((t_template *)gp.gp_stub);
    if (iVar1 == 0) {
      owner_local = (_glist *)0x0;
    }
    else {
      owner_local = (_glist *)getbytes((long)(gp.gp_stub[1].gs_which + -1) * 8 + 0x20);
      (owner_local->gl_obj).te_g.g_pd = scalar_class;
      (owner_local->gl_obj).te_binbuf = (_binbuf *)templatesym;
      gpointer_setglist((t_gpointer *)local_48,owner,(t_scalar *)owner_local);
      word_init((t_word *)&(owner_local->gl_obj).te_outlet,(t_template *)gp.gp_stub,
                (t_gpointer *)local_48);
    }
  }
  return (t_scalar *)owner_local;
}

Assistant:

t_scalar *scalar_new(t_glist *owner, t_symbol *templatesym)
{
    t_scalar *x;
    t_template *template;
    t_gpointer gp;
    gpointer_init(&gp);
    template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(0, "scalar: couldn't find template %s", templatesym->s_name);
        return (0);
    }
    if (!template_cancreate(template))
        return (0);
    x = (t_scalar *)getbytes(sizeof(t_scalar) +
        (template->t_n - 1) * sizeof(*x->sc_vec));
    x->sc_gobj.g_pd = scalar_class;
    x->sc_template = templatesym;
    gpointer_setglist(&gp, owner, x);
    word_init(x->sc_vec, template, &gp);
    return (x);
}